

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32.c
# Opt level: O0

z_word_t byte_swap(z_word_t word)

{
  z_word_t word_local;
  
  return word >> 0x38 | (word & 0xff000000000000) >> 0x28 | (word & 0xff0000000000) >> 0x18 |
         (word & 0xff00000000) >> 8 | (word & 0xff000000) << 8 | (word & 0xff0000) << 0x18 |
         (word & 0xff00) << 0x28 | word << 0x38;
}

Assistant:

local z_word_t byte_swap(word)
    z_word_t word;
{
#  if W == 8
    return
        (word & 0xff00000000000000) >> 56 |
        (word & 0xff000000000000) >> 40 |
        (word & 0xff0000000000) >> 24 |
        (word & 0xff00000000) >> 8 |
        (word & 0xff000000) << 8 |
        (word & 0xff0000) << 24 |
        (word & 0xff00) << 40 |
        (word & 0xff) << 56;
#  else   /* W == 4 */
    return
        (word & 0xff000000) >> 24 |
        (word & 0xff0000) >> 8 |
        (word & 0xff00) << 8 |
        (word & 0xff) << 24;
#  endif
}